

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_abdl_s16_aarch64(uint32_t a,uint32_t b)

{
  int iVar1;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  int32_t tmp_y_3;
  int32_t tmp_x_3;
  int32_t tmp_y_2;
  int32_t tmp_x_2;
  int32_t tmp_y_1;
  int32_t tmp_x_1;
  int32_t tmp_y;
  int32_t tmp_x;
  uint64_t result;
  uint64_t tmp;
  uint32_t b_local;
  uint32_t a_local;
  
  local_44 = (int)(char)a;
  iVar1 = (int)(char)b;
  if (iVar1 < local_44) {
    local_44 = local_44 - iVar1;
  }
  else {
    local_44 = iVar1 - local_44;
  }
  local_48 = (int)(char)(a >> 8);
  iVar1 = (int)(char)(b >> 8);
  if (iVar1 < local_48) {
    local_48 = local_48 - iVar1;
  }
  else {
    local_48 = iVar1 - local_48;
  }
  local_4c = (int)(char)(a >> 0x10);
  iVar1 = (int)(char)(b >> 0x10);
  if (iVar1 < local_4c) {
    local_4c = local_4c - iVar1;
  }
  else {
    local_4c = iVar1 - local_4c;
  }
  local_50 = (int)(char)(a >> 0x18);
  iVar1 = (int)(char)(b >> 0x18);
  if (iVar1 < local_50) {
    local_50 = local_50 - iVar1;
  }
  else {
    local_50 = iVar1 - local_50;
  }
  return (long)local_50 << 0x30 | (long)local_4c << 0x20 | (long)local_48 << 0x10 | (long)local_44;
}

Assistant:

uint64_t HELPER(neon_abdl_s16)(uint32_t a, uint32_t b)
{
    uint64_t tmp;
    uint64_t result;
    DO_ABD(result, a, b, int8_t, int32_t);
    DO_ABD(tmp, a >> 8, b >> 8, int8_t, int32_t);
    result |= tmp << 16;
    DO_ABD(tmp, a >> 16, b >> 16, int8_t, int32_t);
    result |= tmp << 32;
    DO_ABD(tmp, a >> 24, b >> 24, int8_t, int32_t);
    result |= tmp << 48;
    return result;
}